

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Vocabulary.h
# Opt level: O2

void __thiscall
Vocabulary<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::
Vocabulary(Vocabulary<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
           *this,vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                 *words)

{
  string *psVar1;
  pointer puVar2;
  size_t __n;
  __normal_iterator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
  _Var3;
  size_t sVar4;
  uint64_t uVar5;
  uint uVar6;
  size_type __n_00;
  pointer __dest;
  size_t i;
  ulong uVar7;
  long lVar8;
  ulong uVar9;
  ptrdiff_t _Num;
  BooPHF *this_00;
  allocator_type local_2fa;
  hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_> hasher;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  unique_words;
  vector<unsigned_long,_std::allocator<unsigned_long>_> hashes;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  reordered_words;
  
  (this->super_Serializable)._vptr_Serializable = (_func_int **)&PTR_dump_00147da8;
  psVar1 = &this->data;
  (this->data)._M_dataplus._M_p = (pointer)&(this->data).field_2;
  (this->data)._M_string_length = 0;
  (this->data).field_2._M_local_buf[0] = '\0';
  (this->offsets).super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
  super__Vector_impl_data._M_start = (pointer)0x0;
  (this->offsets).super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
  super__Vector_impl_data._M_finish = (pointer)0x0;
  (this->offsets).super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
  super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  this_00 = &this->mphf;
  boomphf::mphf<unsigned_long,_boomphf::SingleHashFunctor<unsigned_long>_>::mphf(this_00);
  std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::vector(&unique_words,words);
  std::
  __sort<__gnu_cxx::__normal_iterator<std::__cxx11::string*,std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>>,__gnu_cxx::__ops::_Iter_less_iter>
            (unique_words.
             super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
             ._M_impl.super__Vector_impl_data._M_start,
             unique_words.
             super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
             ._M_impl.super__Vector_impl_data._M_finish);
  _Var3 = std::
          __unique<__gnu_cxx::__normal_iterator<std::__cxx11::string*,std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>>,__gnu_cxx::__ops::_Iter_equal_to_iter>
                    (unique_words.
                     super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                     ._M_impl.super__Vector_impl_data._M_start,
                     unique_words.
                     super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                     ._M_impl.super__Vector_impl_data._M_finish);
  std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::resize(&unique_words,
           (long)_Var3._M_current -
           (long)unique_words.
                 super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                 ._M_impl.super__Vector_impl_data._M_start >> 5);
  __n_00 = (long)unique_words.
                 super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                 ._M_impl.super__Vector_impl_data._M_finish -
           (long)unique_words.
                 super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                 ._M_impl.super__Vector_impl_data._M_start >> 5;
  if (0xfffffffe < __n_00) {
    __assert_fail("unique_words.size() < (~uint32_t(0))",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/pavellevap[P]ngram_storage/src/Vocabulary.h"
                  ,0x82,"Vocabulary<std::basic_string<char>>::Vocabulary(const vector<string> &)");
  }
  std::vector<unsigned_long,_std::allocator<unsigned_long>_>::vector
            (&hashes,__n_00,(allocator_type *)&reordered_words);
  lVar8 = 0;
  for (uVar7 = 0;
      uVar7 < (ulong)((long)unique_words.
                            super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                            ._M_impl.super__Vector_impl_data._M_finish -
                      (long)unique_words.
                            super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                            ._M_impl.super__Vector_impl_data._M_start >> 5); uVar7 = uVar7 + 1) {
    sVar4 = std::
            hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::
            operator()(&hasher,(string *)
                               ((long)&((unique_words.
                                         super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                         ._M_impl.super__Vector_impl_data._M_start)->_M_dataplus).
                                       _M_p + lVar8));
    hashes.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
    super__Vector_impl_data._M_start[uVar7] = sVar4;
    lVar8 = lVar8 + 0x20;
  }
  if (hashes.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
      super__Vector_impl_data._M_finish ==
      hashes.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
      super__Vector_impl_data._M_start) {
    reordered_words.
    super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ._M_impl.super__Vector_impl_data._M_start = (pointer)0xffffffffffffffff;
    std::vector<unsigned_long,_std::allocator<unsigned_long>_>::emplace_back<unsigned_long>
              (&hashes,(unsigned_long *)&reordered_words);
  }
  boomphf::mphf<unsigned_long,boomphf::SingleHashFunctor<unsigned_long>>::
  mphf<std::vector<unsigned_long,std::allocator<unsigned_long>>>
            ((mphf<unsigned_long,boomphf::SingleHashFunctor<unsigned_long>> *)&reordered_words,
             (long)hashes.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
                   super__Vector_impl_data._M_finish -
             (long)hashes.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
                   super__Vector_impl_data._M_start >> 3,&hashes,8,2.0,true,false,0.03);
  boomphf::mphf<unsigned_long,_boomphf::SingleHashFunctor<unsigned_long>_>::operator=
            (this_00,(mphf<unsigned_long,_boomphf::SingleHashFunctor<unsigned_long>_> *)
                     &reordered_words);
  boomphf::mphf<unsigned_long,_boomphf::SingleHashFunctor<unsigned_long>_>::~mphf
            ((mphf<unsigned_long,_boomphf::SingleHashFunctor<unsigned_long>_> *)&reordered_words);
  std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::vector(&reordered_words,
           (long)unique_words.
                 super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                 ._M_impl.super__Vector_impl_data._M_finish -
           (long)unique_words.
                 super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                 ._M_impl.super__Vector_impl_data._M_start >> 5,&local_2fa);
  lVar8 = 0;
  uVar7 = 0;
  for (uVar9 = 0;
      uVar9 < (ulong)((long)unique_words.
                            super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                            ._M_impl.super__Vector_impl_data._M_finish -
                      (long)unique_words.
                            super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                            ._M_impl.super__Vector_impl_data._M_start >> 5); uVar9 = uVar9 + 1) {
    uVar5 = boomphf::mphf<unsigned_long,_boomphf::SingleHashFunctor<unsigned_long>_>::lookup
                      (this_00,hashes.
                               super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>.
                               _M_impl.super__Vector_impl_data._M_start[uVar9]);
    std::__cxx11::string::_M_assign
              ((string *)
               (reordered_words.
                super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                ._M_impl.super__Vector_impl_data._M_start + uVar5));
    uVar7 = uVar7 + *(long *)((long)&(unique_words.
                                      super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                      ._M_impl.super__Vector_impl_data._M_start)->_M_string_length +
                             lVar8);
    lVar8 = lVar8 + 0x20;
  }
  std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::clear(&unique_words);
  if (hashes.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
      super__Vector_impl_data._M_finish !=
      hashes.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
      super__Vector_impl_data._M_start) {
    hashes.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
    super__Vector_impl_data._M_finish =
         hashes.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
         super__Vector_impl_data._M_start;
  }
  if (uVar7 < 0xffffffff) {
    std::__cxx11::string::resize((ulong)psVar1);
    __dest = (psVar1->_M_dataplus)._M_p;
    std::vector<unsigned_int,_std::allocator<unsigned_int>_>::resize
              (&this->offsets,
               ((long)reordered_words.
                      super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                      ._M_impl.super__Vector_impl_data._M_finish -
                (long)reordered_words.
                      super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                      ._M_impl.super__Vector_impl_data._M_start >> 5) + 1);
    lVar8 = 8;
    uVar7 = 0;
    while( true ) {
      uVar9 = (long)reordered_words.
                    super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                    ._M_impl.super__Vector_impl_data._M_finish -
              (long)reordered_words.
                    super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                    ._M_impl.super__Vector_impl_data._M_start >> 5;
      uVar6 = (int)__dest - *(int *)&(psVar1->_M_dataplus)._M_p;
      puVar2 = (this->offsets).super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>.
               _M_impl.super__Vector_impl_data._M_start;
      if (uVar9 <= uVar7) break;
      puVar2[uVar7] = uVar6;
      __n = *(size_t *)
             ((long)&((reordered_words.
                       super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                       ._M_impl.super__Vector_impl_data._M_start)->_M_dataplus)._M_p + lVar8);
      if (__n != 0) {
        memmove(__dest,*(void **)((long)reordered_words.
                                        super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                        ._M_impl.super__Vector_impl_data._M_start + lVar8 + -8),__n)
        ;
      }
      __dest = __dest + __n;
      uVar7 = uVar7 + 1;
      lVar8 = lVar8 + 0x20;
    }
    puVar2[uVar9] = uVar6;
    std::
    vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ::~vector(&reordered_words);
    std::_Vector_base<unsigned_long,_std::allocator<unsigned_long>_>::~_Vector_base
              (&hashes.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>);
    std::
    vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ::~vector(&unique_words);
    return;
  }
  __assert_fail("data_size < (~uint32_t(0))",
                "/workspace/llm4binary/github/license_all_cmakelists_25/pavellevap[P]ngram_storage/src/Vocabulary.h"
                ,0x95,"Vocabulary<std::basic_string<char>>::Vocabulary(const vector<string> &)");
}

Assistant:

Vocabulary(const vector<string> &words) {
        vector<string> unique_words(words);
        sort(unique_words.begin(), unique_words.end());
        auto it = unique(unique_words.begin(), unique_words.end());
        unique_words.resize(size_t(it - unique_words.begin()));

        assert(unique_words.size() < (~uint32_t(0)));

        std::hash<string> hasher;
        vector<uint64_t> hashes(unique_words.size());
        for (size_t i = 0; i < unique_words.size(); i++)
            hashes[i] = hasher(unique_words[i]);
        if (hashes.size() == 0) // mphf cannot be serialized if key set is empty
            hashes.push_back(ULLONG_MAX);
        mphf = BooPHF(hashes.size(), hashes, 8, 2.0, true, false);

        uint64_t data_size = 0;
        vector<string> reordered_words(unique_words.size());
        for (size_t i = 0; i < unique_words.size(); i++) {
            reordered_words[mphf.lookup(hashes[i])] = unique_words[i];
            data_size += unique_words[i].length();
        }
        unique_words.clear();
        hashes.clear();

        assert(data_size < (~uint32_t(0)));

        data.resize(data_size);
        auto data_end = data.begin();
        offsets.resize(reordered_words.size() + 1);
        for (size_t i = 0; i < reordered_words.size(); i++) {
            offsets[i] = uint32_t(data_end - data.begin());
            data_end = copy(reordered_words[i].begin(), reordered_words[i].end(), data_end);
        }
        offsets[reordered_words.size()] = uint32_t(data_end - data.begin());
    }